

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdCelsiusFogMode::emulate_mthd(MthdCelsiusFogMode *this)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  uVar3 = 0;
  switch(uVar1) {
  case 0x800:
    uVar4 = 1;
    break;
  case 0x801:
    uVar4 = 3;
    break;
  case 0x802:
    uVar4 = 5;
    break;
  case 0x803:
    uVar4 = 7;
    break;
  default:
    if (uVar1 == 0x2601) {
      uVar3 = 0;
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
      uVar3 = 1;
    }
  }
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c;
  uVar5 = uVar2 >> 6 & 4;
  if (uVar5 != 0 || uVar3 != 0) {
    uVar4 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.notify;
    if ((uVar4 & 0x70000000) == 0) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.notify =
           uVar4 | (uVar5 | uVar3) << 0x1c;
      return;
    }
    return;
  }
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c =
         uVar2 & 0xfffffff8 | uVar4;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t err = 0;
		uint32_t rv = 0;
		if (val == 0x800) {
			rv = 1;
		} else if (val == 0x801) {
			rv = 3;
		} else if (val == 0x802) {
			rv = 5;
		} else if (val == 0x803) {
			rv = 7;
		} else if (val == 0x2601) {
			rv = 0;
		} else {
			err |= 1;
		}
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				insrt(exp.celsius_config_c, 0, 3, rv);
			}
		}
	}